

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O2

void __thiscall
libtorrent::session_handle::
async_call<void(libtorrent::aux::session_impl::*)(libtorrent::peer_class_type_filter),libtorrent::peer_class_type_filter_const&>
          (session_handle *this,offset_in_session_impl_to_subr f,peer_class_type_filter *a)

{
  io_context *ctx;
  uint *in_RCX;
  shared_ptr<libtorrent::aux::session_impl> s;
  __shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2> local_88;
  undefined1 local_78 [32];
  uint local_58 [2];
  uint auStack_50 [2];
  uint local_48 [2];
  uint auStack_40 [2];
  uint local_38 [2];
  uint auStack_30 [2];
  
  ::std::__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_88,this);
  if (local_88._M_ptr != (element_type *)0x0) {
    ctx = (local_88._M_ptr)->m_io_context;
    ::std::__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2> *)local_78,
               &local_88);
    local_58 = *(uint (*) [2])in_RCX;
    auStack_50 = *(uint (*) [2])(in_RCX + 2);
    local_48 = *(uint (*) [2])(in_RCX + 4);
    auStack_40 = *(uint (*) [2])(in_RCX + 6);
    local_38 = *(uint (*) [2])(in_RCX + 8);
    auStack_30 = *(uint (*) [2])(in_RCX + 10);
    local_78._16_8_ = f;
    local_78._24_8_ = a;
    boost::asio::
    dispatch<boost::asio::io_context,libtorrent::session_handle::async_call<void(libtorrent::aux::session_impl::*)(libtorrent::peer_class_type_filter),libtorrent::peer_class_type_filter_const&>(void(libtorrent::aux::session_impl::*)(libtorrent::peer_class_type_filter),libtorrent::peer_class_type_filter_const&)const::_lambda()_1_>
              (ctx,(type_conflict16 *)local_78,(type *)0x0);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
    return;
  }
  local_78._0_4_ = invalid_session_handle;
  aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
            ((error_code_enum *)local_78);
}

Assistant:

void session_handle::async_call(Fun f, Args&&... a) const
	{
		std::shared_ptr<session_impl> s = m_impl.lock();
		if (!s) aux::throw_ex<system_error>(errors::invalid_session_handle);
		dispatch(s->get_context(), [=]() mutable
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				(s.get()->*f)(std::forward<Args>(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (system_error const& e) {
				s->alerts().emplace_alert<session_error_alert>(e.code(), e.what());
			} catch (std::exception const& e) {
				s->alerts().emplace_alert<session_error_alert>(error_code(), e.what());
			} catch (...) {
				s->alerts().emplace_alert<session_error_alert>(error_code(), "unknown error");
			}
#endif
		});
	}